

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# losertree.h
# Opt level: O2

void __thiscall loser_tree<unsigned_char_*>::update(loser_tree<unsigned_char_*> *this)

{
  uint uVar1;
  int iVar2;
  Stream *pSVar3;
  uint pos;
  uint __tmp;
  uint uVar4;
  
  pos = this->_stream_offset + *this->_nodes;
  uVar4 = *this->_nodes;
  do {
    do {
      do {
        if (pos < 2) {
          *this->_nodes = uVar4;
          return;
        }
        pos = pos >> 1;
        if (this->_streams[uVar4].n == 0) goto LAB_0020c057;
        pSVar3 = node2stream(this,pos);
      } while (pSVar3->n == 0);
      pSVar3 = node2stream(this,pos);
      iVar2 = cmp(*pSVar3->stream,*this->_streams[uVar4].stream);
    } while (-1 < iVar2);
LAB_0020c057:
    uVar1 = this->_nodes[pos];
    this->_nodes[pos] = uVar4;
    uVar4 = uVar1;
  } while( true );
}

Assistant:

void update()
	{
		//debug() << __PRETTY_FUNCTION__ << std::endl;
		unsigned new_min = _nodes[0];
		for (unsigned i=(_stream_offset+new_min) >> 1; i!=0; i >>= 1) {
			if (stream_empty(_streams[new_min]) or
			    (not stream_empty(node2stream(i)) and
			     cmp(*node2stream(i).stream,
			         *_streams[new_min].stream) < 0)) {
				std::swap(new_min, _nodes[i]);
			}
		}
		_nodes[0] = new_min;
	}